

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O2

void skiwi::skiwi_show_assembly(string *input)

{
  string *args_1;
  string assembly;
  string sStack_68;
  string local_48;
  string local_28;
  
  args_1 = &sStack_68;
  std::__cxx11::string::string((string *)&local_28,(string *)input);
  anon_unknown_1::remove_command(&sStack_68,&local_28);
  skiwi_assembly(&local_48,&sStack_68);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_28);
  (anonymous_namespace)::out<std::__cxx11::string&,char_const(&)[2]>(&local_48,(char (*) [2])args_1)
  ;
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void skiwi_show_assembly(const std::string& input)
  {
  std::string assembly = skiwi_assembly(remove_command(input));
  out(assembly, "\n");
  }